

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O0

void DDecalSlider::InPlaceConstructor(void *mem)

{
  DDecalSlider *this;
  void *mem_local;
  
  this = (DDecalSlider *)DObject::operator_new(0x68,(EInPlace *)mem);
  DDecalSlider(this);
  return;
}

Assistant:

void DDecalSlider::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	arc("starttime", TimeToStart)
		("endtime", TimeToStop)
		("disty", DistY)
		("starty", StartY)
		("started", bStarted);
}